

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

ProfiledInstr * IR::ProfiledInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Func *func)

{
  undefined1 *puVar1;
  Func *func_00;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  ProfiledInstr *this;
  undefined4 *puVar5;
  
  this = (ProfiledInstr *)new<Memory::JitArenaAllocator>(0x60,func->m_alloc,0x3eba5c);
  (this->super_Instr).m_noLazyHelperAssert = false;
  (this->super_Instr).m_next = (Instr *)0x0;
  (this->super_Instr).m_prev = (Instr *)0x0;
  (this->super_Instr).m_func = (Func *)0x0;
  (this->super_Instr).globOptInstrString = (char16 *)0x0;
  (this->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this->super_Instr).ignoreOverflowBitCount = ' ';
  (this->super_Instr).highlight = 0;
  puVar1 = &(this->super_Instr).field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  puVar1 = &(this->super_Instr).field_0x38;
  *puVar1 = *puVar1 & 0x80;
  (this->super_Instr).m_number = 0xffffffff;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014d5708;
  Instr::Init((Instr *)this,opcode,InstrKindProfiled,func);
  if (dstOpnd != (Opnd *)0x0) {
    Instr::SetDst((Instr *)this,dstOpnd);
  }
  if (src1Opnd != (Opnd *)0x0) {
    if ((this->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004b42f5;
      *puVar5 = 0;
    }
    func_00 = (this->super_Instr).m_func;
    if (src1Opnd->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_004b42f5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    bVar4 = src1Opnd->field_0xb;
    if ((bVar4 & 2) != 0) {
      src1Opnd = Opnd::Copy(src1Opnd,func_00);
      bVar4 = src1Opnd->field_0xb;
    }
    src1Opnd->field_0xb = bVar4 | 2;
    (this->super_Instr).m_src1 = src1Opnd;
  }
  (this->u).ldElemInfo = (LdElemInfo *)0x0;
  return this;
}

Assistant:

ProfiledInstr *
ProfiledInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Func * func)
{
    ProfiledInstr * profiledInstr = JitAnew(func->m_alloc, IR::ProfiledInstr);
    profiledInstr->Init(opcode, InstrKindProfiled, func);

    if (dstOpnd)
    {
        profiledInstr->SetDst(dstOpnd);
    }
    if (src1Opnd)
    {
        profiledInstr->SetSrc1(src1Opnd);
    }

    profiledInstr->u.ldElemInfo = nullptr;
    return profiledInstr;
}